

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O3

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::readVectorsFromFile
          (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this,char *filename,bool withTimeStamp)

{
  uint uVar1;
  iterator iVar2;
  char cVar3;
  double *pdVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined7 in_register_00000011;
  long lVar7;
  size_t __size;
  long lVar8;
  int k;
  vector<double,_std::allocator<double>_> doublecontainer;
  Vector v;
  double component;
  string s;
  stringstream ss;
  ifstream f;
  int local_42c;
  double *local_428;
  iterator iStack_420;
  double *local_418;
  Matrix<double,__1,_1,_0,__1,_1> local_408;
  undefined4 local_3f8;
  uint local_3f4;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_3f0;
  double local_3e8;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [16];
  long local_3c0 [4];
  byte abStack_3a0 [96];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  local_3f8 = (undefined4)CONCAT71(in_register_00000011,withTimeStamp);
  this->k_ = 0;
  local_3f0 = this;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear(&this->v_);
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)filename);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    local_3e0 = local_3d0;
    local_3d8 = 0;
    local_3d0[0] = 0;
    local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_42c = 0;
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_3e0,cVar3);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_3c0,(string *)&local_3e0,_S_out|_S_in);
      if ((char)local_3f8 != '\0') {
        std::istream::operator>>((istream *)local_3c0,&local_42c);
      }
      uVar1 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
      if ((uVar1 & 5) != 0) {
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
        break;
      }
      local_428 = (double *)0x0;
      iStack_420._M_current = (double *)0x0;
      local_418 = (double *)0x0;
      while (std::istream::_M_extract<double>((double *)local_3c0),
            iVar2._M_current = iStack_420._M_current, pdVar4 = local_428,
            (abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0) {
        if (iStack_420._M_current == local_418) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_428,iStack_420,&local_3e8);
        }
        else {
          *iStack_420._M_current = local_3e8;
          iStack_420._M_current = iStack_420._M_current + 1;
        }
      }
      __size = (long)iStack_420._M_current - (long)local_428;
      lVar8 = (long)__size >> 3;
      local_3f4 = uVar1;
      if (lVar8 < 0) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      lVar5 = lVar8;
      if (local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != lVar8) {
        free(local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        if (iVar2._M_current == pdVar4) {
          pdVar4 = (double *)0x0;
        }
        else {
          pdVar4 = (double *)malloc(__size);
          if (__size != 8 && ((ulong)pdVar4 & 0xf) != 0) {
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pdVar4 == (double *)0x0) {
            puVar6 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar6 = std::ostream::_M_insert<long>;
            __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
        lVar5 = (long)iStack_420._M_current - (long)local_428 >> 3;
        local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar4;
      }
      local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           lVar8;
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          if (lVar8 == lVar7) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [lVar7] = local_428[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
      setValue(local_3f0,&local_408,(long)local_42c);
      local_42c = local_42c + 1;
      if (local_428 != (double *)0x0) {
        operator_delete(local_428);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
      std::ios_base::~ios_base(local_340);
    } while ((local_3f4 & 5) == 0);
    free(local_408.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::readVectorsFromFile(const char * filename, bool withTimeStamp )
{
  reset();

  std::ifstream f;

  f.open(filename);

  if (f.is_open())
  {
    std::string s;
    Vector v;
    int k=0;

    bool continuation=true;

    while (continuation)
    {
      std::getline(f,s);

      std::stringstream ss(s);

      if (withTimeStamp)
      {
        ss >> k;
      }



      if (f.fail())
        continuation=false;
      else
      {
        std::vector<double> doublecontainer;
        double component;
        bool readingVector = true;
        while (readingVector)
        {
          ss>> component;

          if (ss.fail())
          {
            readingVector=false;
          }
          else
          {
            doublecontainer.push_back(component);
          }
        }
        v.resize(Index(doublecontainer.size()));
        for (Index i=0 ; i<Index(doublecontainer.size()) ; ++i)
        {
          v(i)=doublecontainer[size_t(i)];
        }
        setValue(v,k);
        ++k;

      }
    }
  }
}